

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O0

apx_error_t deserializer_pop_state(apx_vm_deserializer_t *self)

{
  apx_vm_readState_t *self_00;
  uint32_t uVar1;
  apx_vm_readState_t *paVar2;
  int local_24;
  apx_error_t result;
  apx_vm_readState_t *child_state;
  apx_vm_deserializer_t *self_local;
  
  if (self->state == (apx_vm_readState_t *)0x0) {
    __assert_fail("self->state != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/deserializer.c"
                  ,0x625,"apx_error_t deserializer_pop_state(apx_vm_deserializer_t *)");
  }
  while( true ) {
    uVar1 = adt_stack_size(&self->stack);
    if (uVar1 == 0) {
      return 0;
    }
    self_00 = self->state;
    if (self_00 == (apx_vm_readState_t *)0x0) {
      __assert_fail("child_state != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/deserializer.c"
                    ,0x629,"apx_error_t deserializer_pop_state(apx_vm_deserializer_t *)");
    }
    paVar2 = (apx_vm_readState_t *)adt_stack_top(&self->stack);
    self->state = paVar2;
    adt_stack_pop(&self->stack);
    if (self->state->type_code != '\x0f') {
      state_delete(self_00);
      return 0xb;
    }
    if (self->state->value_type == DTL_DV_HASH) {
      local_24 = state_create_child_value_from_child_state(self->state,self_00);
    }
    else if (self->state->value_type == DTL_DV_ARRAY) {
      local_24 = state_push_value_from_child_state(self->state,self_00);
    }
    else {
      state_delete(self_00);
      local_24 = 0xb;
    }
    if (local_24 != 0) break;
    state_delete(self_00);
    if ((self->state->is_last_field & 1U) == 0) {
      return 0;
    }
  }
  state_delete(self_00);
  return local_24;
}

Assistant:

static apx_error_t deserializer_pop_state(apx_vm_deserializer_t* self)
{
   assert(self->state != NULL);
   while (adt_stack_size(&self->stack) > 0)
   {
      apx_vm_readState_t* child_state = self->state;
      assert(child_state != NULL);
      self->state = adt_stack_top(&self->stack);
      adt_stack_pop(&self->stack);
      if (self->state->type_code == APX_TYPE_CODE_RECORD)
      {
         apx_error_t result = APX_NO_ERROR;
         if (self->state->value_type == DTL_DV_HASH) //Normal record
         {
            result = state_create_child_value_from_child_state(self->state, child_state);
         }
         else if (self->state->value_type == DTL_DV_ARRAY) //Array of records
         {
            result = state_push_value_from_child_state(self->state, child_state);
         }
         else
         {
            state_delete(child_state);
            result = APX_NOT_IMPLEMENTED_ERROR;
         }
         if (result != APX_NO_ERROR)
         {
            state_delete(child_state);
            return result;
         }
      }
      else
      {
         state_delete(child_state);
         return APX_NOT_IMPLEMENTED_ERROR;
      }
      state_delete(child_state);
      if (!self->state->is_last_field)
      {
         break;
      }
   }
   return APX_NO_ERROR;
}